

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.h
# Opt level: O0

Graph<Node> * __thiscall
Graph<Node>::operator*(Graph<Node> *__return_storage_ptr__,Graph<Node> *this,Graph<Node> *other)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  Edge *pEVar5;
  Edge *pEVar6;
  undefined1 local_12c [8];
  Edge g2Edge;
  Edge g1Edge;
  int j;
  int iStack_108;
  bool added;
  int i;
  undefined1 local_fd;
  undefined1 local_f0 [8];
  Graph<Node> g2;
  Graph<Node> g1;
  Graph<Node> *other_local;
  Graph<Node> *this_local;
  Graph<Node> *ans;
  
  g1.inCC._8_8_ = other;
  Graph((Graph<Node> *)&g2.inCC._size,this);
  Graph((Graph<Node> *)local_f0,(Graph<Node> *)g1.inCC._8_8_);
  pEVar5 = vector<Edge>::begin((vector<Edge> *)&g1.G._size);
  pEVar6 = vector<Edge>::end((vector<Edge> *)&g1.G._size);
  std::sort<Edge*>(pEVar5,pEVar6);
  pEVar5 = vector<Edge>::begin((vector<Edge> *)&g2.G._size);
  pEVar6 = vector<Edge>::end((vector<Edge> *)&g2.G._size);
  std::sort<Edge*>(pEVar5,pEVar6);
  local_fd = 0;
  i = size((Graph<Node> *)&g2.inCC._size);
  iStack_108 = size((Graph<Node> *)local_f0);
  iVar3 = max<int>(&i,&stack0xfffffffffffffef8);
  Graph(__return_storage_ptr__,iVar3);
  j = 0;
  do {
    iVar3 = edgeCnt((Graph<Node> *)&g2.inCC._size);
    if (iVar3 <= j) {
      local_fd = 1;
      ~Graph((Graph<Node> *)local_f0);
      ~Graph((Graph<Node> *)&g2.inCC._size);
      return __return_storage_ptr__;
    }
    bVar1 = 0;
    g1Edge._nodeD = 0;
    while( true ) {
      iVar3 = edgeCnt((Graph<Node> *)local_f0);
      bVar2 = false;
      if (g1Edge._nodeD < iVar3) {
        bVar2 = (bool)(bVar1 ^ 1);
      }
      if (!bVar2) break;
      getEdge((Graph<Node> *)&g2Edge._nodeD,&g2.inCC._size);
      getEdge((Graph<Node> *)local_12c,(int *)local_f0);
      bVar2 = Edge::operator==((Edge *)&g2Edge._nodeD,(Edge *)local_12c);
      if (bVar2) {
        iVar3 = Edge::getCost((Edge *)&g2Edge._nodeD);
        iVar4 = Edge::getCost((Edge *)local_12c);
        if (iVar4 <= iVar3) goto LAB_00102051;
        bVar1 = 1;
        addEdge(__return_storage_ptr__,(Edge *)&g2Edge._nodeD);
      }
      else {
LAB_00102051:
        bVar2 = Edge::operator==((Edge *)&g2Edge._nodeD,(Edge *)local_12c);
        if (bVar2) {
          bVar1 = 1;
          addEdge(__return_storage_ptr__,(Edge *)local_12c);
        }
      }
      Edge::~Edge((Edge *)local_12c);
      Edge::~Edge((Edge *)&g2Edge._nodeD);
      g1Edge._nodeD = g1Edge._nodeD + 1;
    }
    j = j + 1;
  } while( true );
}

Assistant:

Graph operator * (const Graph &other) const {
        Graph g1 = *this;
        Graph g2 = other;

        std::sort(g1.edges.begin(), g1.edges.end());
//        g1.edges.mergeSort(0, g1._edgeCnt - 1, [](Edge a, Edge b) {
//            return a < b;
//        });

        std::sort(g2.edges.begin(), g2.edges.end());
//        g2.edges.mergeSort(0, g2._edgeCnt - 1, [](Edge a, Edge b) {
//            return a < b;
//        });

        Graph ans(max(g1.size(), g2.size()));

        for (int i = 0; i < g1.edgeCnt(); ++i) {
            bool added = false;
            for (int j = 0; j < g2.edgeCnt() and !added; ++j) {
                Edge g1Edge = g1.getEdge(i);
                Edge g2Edge = g2.getEdge(j);
                if (g1Edge == g2Edge and g1Edge.getCost() < g2Edge.getCost()) {
                    added = true;
                    ans.addEdge(g1Edge);
                }
                else if (g1Edge == g2Edge) {
                    added = true;
                    ans.addEdge(g2Edge);
                }
            }

//            if (!added) {
//                ans.addEdge(g1.getEdge(i));
//            }
        }

        return ans;
    }